

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

uint32 rw::makeTreeAddr(RGBA color)

{
  uint uVar1;
  undefined4 local_24;
  uint32 mask;
  uint32 a;
  uint32 b;
  uint32 g;
  uint32 r;
  uint32 addr;
  int32 i;
  RGBA color_local;
  
  g = 0;
  b = 1;
  a = 2;
  mask = 4;
  local_24 = 8;
  for (r = 0; (int)r < 8; r = r + 1) {
    uVar1 = 0x80 >> ((byte)r & 0x1f);
    if (((uint)color & 0xff & uVar1) != 0) {
      g = b | g;
    }
    if (((uint)color >> 8 & 0xff & uVar1) != 0) {
      g = a | g;
    }
    if (((uint)color >> 0x10 & 0xff & uVar1) != 0) {
      g = mask | g;
    }
    if (((uint)color >> 0x18 & uVar1) != 0) {
      g = local_24 | g;
    }
    b = b << 4;
    a = a << 4;
    mask = mask << 4;
    local_24 = local_24 << 4;
  }
  return g;
}

Assistant:

static uint32
makeTreeAddr(RGBA color)
{
	int32 i;
	uint32 addr = 0;
	uint32 r = 1;
	uint32 g = 2;
	uint32 b = 4;
	uint32 a = 8;
	for(i = 0; i < 8; i++){
		uint32 mask = 0x80>>i;
		if(color.red & mask) addr |= r;
		if(color.green & mask) addr |= g;
		if(color.blue & mask) addr |= b;
		if(color.alpha & mask) addr |= a;
		r <<= 4;
		g <<= 4;
		b <<= 4;
		a <<= 4;
	}
	return addr;
}